

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::uconv_converter::uconv_converter(uconv_converter *this,string *encoding)

{
  char cVar1;
  UConverter *pUVar2;
  invalid_charset_error *this_00;
  UErrorCode err;
  string local_40;
  
  (this->super_base_converter)._vptr_base_converter = (_func_int **)&PTR__uconv_converter_001dab78;
  std::__cxx11::string::string((string *)&this->encoding_,(string *)encoding);
  err = U_ZERO_ERROR;
  pUVar2 = (UConverter *)ucnv_open_70((encoding->_M_dataplus)._M_p);
  this->cvt_ = pUVar2;
  ucnv_setFromUCallBack_70(pUVar2,UCNV_FROM_U_CALLBACK_STOP_70,0,0,0,&err);
  ucnv_setToUCallBack_70(this->cvt_,UCNV_TO_U_CALLBACK_STOP_70,0,0,0,&err);
  if (this->cvt_ != (UConverter *)0x0) {
    if (err < U_ILLEGAL_ARGUMENT_ERROR) {
      cVar1 = ucnv_getMaxCharSize_70();
      this->max_len_ = (int)cVar1;
      return;
    }
    ucnv_close_70();
  }
  this_00 = (invalid_charset_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,(string *)encoding);
  conv::invalid_charset_error::invalid_charset_error(this_00,&local_40);
  __cxa_throw(this_00,&conv::invalid_charset_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

uconv_converter(std::string const &encoding) :
            encoding_(encoding)
        {
            UErrorCode err=U_ZERO_ERROR;
            
            // No need to check err each time, this
            // is how ICU works.
            cvt_ = ucnv_open(encoding.c_str(),&err);
            ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_STOP,0,0,0,&err);
            ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_STOP,0,0,0,&err);

            if(!cvt_ || U_FAILURE(err)) {
                if(cvt_)
                    ucnv_close(cvt_);
                throw conv::invalid_charset_error(encoding);
            }
            
            max_len_ = ucnv_getMaxCharSize(cvt_);
        }